

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::ColumnMetaData::ColumnMetaData(ColumnMetaData *this,ColumnMetaData *other124)

{
  _SizeStatistics__isset *p_Var1;
  int64_t iVar2;
  
  *(undefined ***)this = &PTR__ColumnMetaData_017b5998;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encodings).
  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->encodings).
  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->encodings).
  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Statistics::Statistics(&this->statistics);
  (this->encoding_stats).
  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  .
  super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->encoding_stats).
  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  .
  super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->encoding_stats).
  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  .
  super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined ***)&this->size_statistics = &PTR__SizeStatistics_017b4a90;
  (this->size_statistics).unencoded_byte_array_data_bytes = 0;
  (this->size_statistics).repetition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->size_statistics).repetition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->size_statistics).repetition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->size_statistics).definition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->size_statistics).definition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->size_statistics).definition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  p_Var1 = &(this->size_statistics).__isset;
  *p_Var1 = (_SizeStatistics__isset)((byte)*p_Var1 & 0xf8);
  this->__isset = (_ColumnMetaData__isset)0x0;
  this->type = other124->type;
  std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>::
  operator=(&(this->encodings).
             super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            ,&(other124->encodings).
              super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->path_in_schema,
              &(other124->path_in_schema).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  this->codec = other124->codec;
  iVar2 = other124->total_uncompressed_size;
  this->num_values = other124->num_values;
  this->total_uncompressed_size = iVar2;
  this->total_compressed_size = other124->total_compressed_size;
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::operator=
            (&(this->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,
             &(other124->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>);
  iVar2 = other124->index_page_offset;
  this->data_page_offset = other124->data_page_offset;
  this->index_page_offset = iVar2;
  this->dictionary_page_offset = other124->dictionary_page_offset;
  Statistics::operator=(&this->statistics,&other124->statistics);
  std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ::operator=(&(this->encoding_stats).
               super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
              ,&(other124->encoding_stats).
                super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
             );
  this->bloom_filter_offset = other124->bloom_filter_offset;
  this->bloom_filter_length = other124->bloom_filter_length;
  SizeStatistics::operator=(&this->size_statistics,&other124->size_statistics);
  this->__isset = other124->__isset;
  return;
}

Assistant:

ColumnMetaData::ColumnMetaData(const ColumnMetaData& other124) {
  type = other124.type;
  encodings = other124.encodings;
  path_in_schema = other124.path_in_schema;
  codec = other124.codec;
  num_values = other124.num_values;
  total_uncompressed_size = other124.total_uncompressed_size;
  total_compressed_size = other124.total_compressed_size;
  key_value_metadata = other124.key_value_metadata;
  data_page_offset = other124.data_page_offset;
  index_page_offset = other124.index_page_offset;
  dictionary_page_offset = other124.dictionary_page_offset;
  statistics = other124.statistics;
  encoding_stats = other124.encoding_stats;
  bloom_filter_offset = other124.bloom_filter_offset;
  bloom_filter_length = other124.bloom_filter_length;
  size_statistics = other124.size_statistics;
  __isset = other124.__isset;
}